

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neighborhoods.cpp
# Opt level: O1

NeighborIndices __thiscall lume::Neighborhoods::neighbor_indices(Neighborhoods *this,GrobIndex gi)

{
  LumeError *this_00;
  string *psVar1;
  NeighborIndices NVar2;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  if (this->m_grobBaseInds[(ulong)gi & 0xffffffff] <
      (uint)((ulong)((long)(this->m_offsets).m_vector.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)(this->m_offsets).m_vector.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 2)) {
    NVar2.m_neighborhoods = this;
    NVar2.m_grobIndex = gi;
    return NVar2;
  }
  this_00 = (LumeError *)__cxa_allocate_exception(0x30);
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_40,
             "This Neighborhoods instance doesn\'t provide neighbors for grobs of type ","");
  psVar1 = GrobName_abi_cxx11_(gi.grobType);
  psVar1 = (string *)
           std::__cxx11::string::_M_append((char *)local_40,(ulong)(psVar1->_M_dataplus)._M_p);
  LumeError::LumeError(this_00,psVar1);
  __cxa_throw(this_00,&LumeError::typeinfo,LumeError::~LumeError);
}

Assistant:

NeighborIndices Neighborhoods::
neighbor_indices (const GrobIndex gi) const
{
	const index_t baseIndex = base_index (gi);

	if (baseIndex >= m_offsets.size())
		throw LumeError (std::string("This Neighborhoods instance doesn't provide "
		                             "neighbors for grobs of type ")
						.append (GrobName (gi.grobType)));

	return NeighborIndices (gi, this);
}